

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multidim_static_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  MStack_37e38;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  MStack_349b8;
  data_t pdStack_31538;
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<3,_112>,_multidim::sspair<2,_56>,_multidim::sspair<7,_8>,_multidim::sspair<4,_2>,_multidim::sspair<2,_1>_>_>
  MStack_31530;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  MStack_31528;
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<3,_112>,_multidim::sspair<2,_56>,_multidim::sspair<7,_8>,_multidim::sspair<4,_2>,_multidim::sspair<2,_1>_>_>
  MStack_2e0a0;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  MStack_2e098;
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_1>,_multidim::sspair<3,_5>,_multidim::sspair<2,_15>,_multidim::sspair<7,_30>,_multidim::sspair<4,_210>,_multidim::sspair<2,_840>_>_>
  MStack_2ac10;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  MStack_2ac08;
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<8,_1>,_multidim::sspair<7,_8>,_multidim::sspair<6,_56>,_multidim::sspair<5,_336>_>_>
  MStack_27780;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  MStack_27778;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  MStack_242f8;
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
  MStack_20e70;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  MStack_20e68;
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
  MStack_1d9e0;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  MStack_1d9d8;
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<1,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  MStack_1a558;
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  MStack_1a550;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  MStack_1a548;
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<1,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  MStack_170c0;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  MStack_170b8;
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<3,_8>,_multidim::sspair<8,_1>_>_>
  MStack_13c30;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  MStack_13c28;
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<3,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  MStack_107a0;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  MStack_10798;
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<3,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  local_d310;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<1,_1>,_multidim::sspair<2,_1>,_multidim::sspair<3,_2>,_multidim::sspair<4,_6>_>_>
  local_d308;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  local_d248;
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>_>_>
  local_9dc0;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  local_9db8;
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
  local_6930;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  local_6928;
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  local_34a0;
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  local_3498;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::MultiDimN(&local_3498);
  dumpinfo<multidim::MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>>
            (&local_3498,"byrow(2,2,3,4)");
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::MultiDimN(&local_6928);
  local_34a0 = multidim::
               MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
               ::limit1<0>(&local_6928,2);
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>>
            (&local_34a0,"byrow(2,2,3,4) fix dim 0 at index 2");
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::MultiDimN(&local_9db8);
  local_6930 = multidim::
               MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
               ::limit1<2>(&local_9db8,2);
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<8,1>>>>
            (&local_6930,"byrow(2,2,3,4) fix dim 2 at index 2");
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::MultiDimN(&local_d248);
  local_9dc0 = multidim::
               MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
               ::limit1<3>(&local_d248,2);
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>>>>
            (&local_9dc0,"byrow(2,2,3,4) fix dim 3 at index 2");
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<1,_1>,_multidim::sspair<2,_1>,_multidim::sspair<3,_2>,_multidim::sspair<4,_6>_>_>
  ::MultiDimN(&local_d308);
  dumpinfo<multidim::MultiDimN<double,multidim::type_sequence<multidim::sspair<1,1>,multidim::sspair<2,1>,multidim::sspair<3,2>,multidim::sspair<4,6>>>>
            (&local_d308,"bycol(2,2,3,4)");
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::MultiDimN(&MStack_10798);
  local_d310 = multidim::
               MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
               ::limit1block<0,3>((MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
                                   *)&MStack_10798,0);
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<3,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>>
            (&local_d310,"getblock0");
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::MultiDimN(&MStack_13c28);
  MStack_107a0 = multidim::
                 MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
                 ::limit1block<1,3>((MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
                                     *)&MStack_13c28,0);
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<3,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>>
            (&MStack_107a0,"getblock1");
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::MultiDimN(&MStack_170b8);
  MStack_13c30 = multidim::
                 MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
                 ::limit1block<2,3>((MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
                                     *)&MStack_170b8,0);
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<3,8>,multidim::sspair<8,1>>>>
            (&MStack_13c30,"getblock2");
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::MultiDimN(&MStack_1a548);
  MStack_170c0 = multidim::
                 MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
                 ::limit1block<0,1>((MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
                                     *)&MStack_1a548,0);
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<1,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>>
            (&MStack_170c0,"getblock0 non squeezed");
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::MultiDimN(&MStack_1d9d8);
  MStack_1a558 = multidim::
                 MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
                 ::limit1block<0,1>((MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
                                     *)&MStack_1d9d8,0);
  MStack_1a550 = multidim::
                 MultiDimNView<double,_multidim::type_sequence<multidim::sspair<1,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
                 ::squeeze(&MStack_1a558);
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>>
            (&MStack_1a550,"getblock0 squeezed");
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::MultiDimN(&MStack_20e68);
  MStack_1d9e0 = multidim::
                 MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
                 ::limit1<2>(&MStack_20e68,2);
  multidim::
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
  ::setZero(&MStack_1d9e0);
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::MultiDimN(&MStack_242f8);
  MStack_20e70 = multidim::
                 MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
                 ::limit1<2>(&MStack_242f8,2);
  multidim::
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
  ::setZero(&MStack_20e70);
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::MultiDimN(&MStack_27778);
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::setZero(&MStack_27778);
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::MultiDimN(&MStack_2ac08);
  MStack_27780 = multidim::
                 MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
                 ::permutedim<3,2,1,0>
                           ((MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
                             *)&MStack_2ac08);
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<8,1>,multidim::sspair<7,8>,multidim::sspair<6,56>,multidim::sspair<5,336>>>>
            (&MStack_27780,"flip byrow(4,3,2,2)");
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::MultiDimN(&MStack_2e098);
  MStack_2ac10 = multidim::
                 MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
                 ::reshapeC<5,3,2,7,4,2>
                           ((MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
                             *)&MStack_2e098);
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,1>,multidim::sspair<3,5>,multidim::sspair<2,15>,multidim::sspair<7,30>,multidim::sspair<4,210>,multidim::sspair<2,840>>>>
            (&MStack_2ac10,"reshape col major(5,3,2,7,4,2)");
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::MultiDimN(&MStack_31528);
  MStack_2e0a0 = multidim::
                 MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
                 ::reshapeR<5,3,2,7,4,2>
                           ((MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
                             *)&MStack_31528);
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<3,112>,multidim::sspair<2,56>,multidim::sspair<7,8>,multidim::sspair<4,2>,multidim::sspair<2,1>>>>
            (&MStack_2e0a0,"reshape row major(5,3,2,7,4,2)");
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::MultiDimN(&MStack_349b8);
  pdStack_31538 =
       (data_t)multidim::
               MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
               ::reshapeC<5,3,2,7,4,2>
                         ((MultiDimN<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
                           *)&MStack_349b8);
  MStack_31530 = multidim::
                 MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,1>,multidim::sspair<3,5>,multidim::sspair<2,15>,multidim::sspair<7,30>,multidim::sspair<4,210>,multidim::sspair<2,840>>>
                 ::reshapeR<5,3,2,7,4,2>
                           ((MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,1>,multidim::sspair<3,5>,multidim::sspair<2,15>,multidim::sspair<7,30>,multidim::sspair<4,210>,multidim::sspair<2,840>>>
                             *)&pdStack_31538);
  dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<3,112>,multidim::sspair<2,56>,multidim::sspair<7,8>,multidim::sspair<4,2>,multidim::sspair<2,1>>>>
            (&MStack_31530,"reshape row major(5,3,2,7,4,2)");
  poVar2 = std::operator<<((ostream *)&std::cout,"offset ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x4a);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"offset ");
  multidim::
  MultiDimN<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
  ::MultiDimN(&MStack_37e38);
  iVar1 = multidim::
          MultiDimNBase<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
          ::offset<int,int,int,int>
                    ((MultiDimNBase<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<7,8>,multidim::sspair<8,1>>>
                      *)&MStack_37e38,0,1,2,2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	using X = multidim::MultiDimNRow<double,5,6,7,8> ;
	using Y = multidim::MultiDimNCol<double,1,2,3,4> ;
	dumpinfo(X(),"byrow(2,2,3,4)");
	dumpinfo(X().limit1<0>(2),"byrow(2,2,3,4) fix dim 0 at index 2");
	dumpinfo(X().limit1<2>(2),"byrow(2,2,3,4) fix dim 2 at index 2");
	dumpinfo(X().limit1<3>(2),"byrow(2,2,3,4) fix dim 3 at index 2");
	// compile error dumpinfo(X().limit1<4>(2),"byrow(2,2,3,4) fix beyond");
	dumpinfo(Y(),"bycol(2,2,3,4)");

	dumpinfo(X().limit1block<0,3>(0),"getblock0");
	dumpinfo(X().limit1block<1,3>(0),"getblock1");
	dumpinfo(X().limit1block<2,3>(0),"getblock2"); // 2 2 1 4
	//BUG dumpinfo(X().limit1block<3,1>(1),"getblocklast");
	dumpinfo(X().limit1block<0,1>(0),"getblock0 non squeezed");
	dumpinfo(X().limit1block<0,1>(0).squeeze(),"getblock0 squeezed");
	
	X().limit1<2>(2).setZero();
	X().limit1<2>(2).setZero();
	X().setZero();

	dumpinfo(X().permutedim<3,2,1,0>(),"flip byrow(4,3,2,2)");
	
	dumpinfo(X().reshapeC<5,3,2,7,4,2>(),"reshape col major(5,3,2,7,4,2)");

	dumpinfo(X().reshapeR<5,3,2,7,4,2>(),"reshape row major(5,3,2,7,4,2)");

	dumpinfo(X().reshapeC<5,3,2,7,4,2>().reshapeR<5,3,2,7,4,2>(),"reshape row major(5,3,2,7,4,2)");
	
	// as static
	// as args
	// as initializer list
	// TBD as eigen
	std::cout << "offset " << X::offsetvalue<0,1,2,2>::value << std::endl;
	std::cout << "offset " << X().offset(0,1,2,2) << std::endl;
	//compiletime: std::cout << "offset " << X().offset(0,1,2,2,3) << std::endl;
	//runtime: std::cout << "offset " << X().offset({0,1,2,2,4}) << std::endl;

//	std::cout << "dimension 3 is " << x.getsize<3>() << std::endl;
//	std::cout << "dimension 3 is " << x.getsize(3) << std::endl;
	return 0;
}